

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int reportComment(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  block *pbVar1;
  XML_Char *s;
  BLOCK *pBVar2;
  BLOCK *pBVar3;
  
  if (parser->m_commentHandler == (XML_CommentHandler)0x0) {
    if (parser->m_defaultHandler == (XML_DefaultHandler)0x0) {
      return 1;
    }
    reportDefault(parser,enc,start,end);
    return 1;
  }
  s = poolStoreString(&parser->m_tempPool,enc,start + (long)enc->minBytesPerChar * 4,
                      end + (long)enc->minBytesPerChar * -3);
  if (s == (XML_Char *)0x0) {
    return 0;
  }
  normalizeLines(s);
  (*parser->m_commentHandler)(parser->m_handlerArg,s);
  pBVar3 = (parser->m_tempPool).blocks;
  pBVar2 = (parser->m_tempPool).freeBlocks;
  if (pBVar2 != (BLOCK *)0x0) {
    pbVar1 = pBVar3;
    if (pBVar3 == (BLOCK *)0x0) goto LAB_0045b79a;
    do {
      pBVar3 = pbVar1;
      pbVar1 = pBVar3->next;
      pBVar3->next = pBVar2;
      pBVar2 = pBVar3;
    } while (pbVar1 != (block *)0x0);
  }
  (parser->m_tempPool).freeBlocks = pBVar3;
LAB_0045b79a:
  (parser->m_tempPool).blocks = (BLOCK *)0x0;
  (parser->m_tempPool).end = (XML_Char *)0x0;
  (parser->m_tempPool).ptr = (XML_Char *)0x0;
  (parser->m_tempPool).start = (XML_Char *)0x0;
  return 1;
}

Assistant:

static int
reportComment(XML_Parser parser, const ENCODING *enc,
              const char *start, const char *end)
{
  XML_Char *data;
  if (!parser->m_commentHandler) {
    if (parser->m_defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  data = poolStoreString(&parser->m_tempPool,
                         enc,
                         start + enc->minBytesPerChar * 4,
                         end - enc->minBytesPerChar * 3);
  if (!data)
    return 0;
  normalizeLines(data);
  parser->m_commentHandler(parser->m_handlerArg, data);
  poolClear(&parser->m_tempPool);
  return 1;
}